

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::(anonymous_namespace)::TypeName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field,
          ClassNameResolver *name_resolver,bool boxed)

{
  ClassNameResolver *pCVar1;
  JavaType JVar2;
  Descriptor *descriptor;
  EnumDescriptor *descriptor_00;
  allocator<char> local_39;
  string_view local_38;
  byte local_21;
  ClassNameResolver *pCStack_20;
  bool boxed_local;
  ClassNameResolver *name_resolver_local;
  FieldDescriptor *field_local;
  
  local_21 = (byte)name_resolver & 1;
  pCStack_20 = (ClassNameResolver *)field;
  name_resolver_local = (ClassNameResolver *)this;
  field_local = (FieldDescriptor *)__return_storage_ptr__;
  JVar2 = GetJavaType((FieldDescriptor *)this);
  pCVar1 = pCStack_20;
  if (JVar2 == JAVATYPE_MESSAGE) {
    descriptor = FieldDescriptor::message_type((FieldDescriptor *)name_resolver_local);
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              (__return_storage_ptr__,pCVar1,descriptor);
  }
  else {
    JVar2 = GetJavaType((FieldDescriptor *)name_resolver_local);
    pCVar1 = pCStack_20;
    if (JVar2 == JAVATYPE_ENUM) {
      descriptor_00 = FieldDescriptor::enum_type((FieldDescriptor *)name_resolver_local);
      ClassNameResolver::GetImmutableClassName<google::protobuf::EnumDescriptor>
                (__return_storage_ptr__,pCVar1,descriptor_00);
    }
    else {
      if ((local_21 & 1) == 0) {
        JVar2 = GetJavaType((FieldDescriptor *)name_resolver_local);
        local_38 = PrimitiveTypeName(JVar2);
      }
      else {
        JVar2 = GetJavaType((FieldDescriptor *)name_resolver_local);
        local_38 = BoxedPrimitiveTypeName(JVar2);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)__return_storage_ptr__,&local_38,&local_39);
      std::allocator<char>::~allocator(&local_39);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TypeName(const FieldDescriptor* field,
                     ClassNameResolver* name_resolver, bool boxed) {
  if (GetJavaType(field) == JAVATYPE_MESSAGE) {
    return name_resolver->GetImmutableClassName(field->message_type());
  } else if (GetJavaType(field) == JAVATYPE_ENUM) {
    return name_resolver->GetImmutableClassName(field->enum_type());
  } else {
    return std::string(boxed ? BoxedPrimitiveTypeName(GetJavaType(field))
                             : PrimitiveTypeName(GetJavaType(field)));
  }
}